

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

SUNErrCode N_VBufUnpack_ManyVector(N_Vector x,void *buf)

{
  long in_RAX;
  void *pvVar1;
  long lVar2;
  sunindextype offset;
  long local_28;
  
  pvVar1 = buf;
  local_28 = in_RAX;
  for (lVar2 = 0; lVar2 < *x->content; lVar2 = lVar2 + 1) {
    N_VBufUnpack(*(undefined8 *)(*(long *)((long)x->content + 0x10) + lVar2 * 8),pvVar1);
    N_VBufSize(*(undefined8 *)(*(long *)((long)x->content + 0x10) + lVar2 * 8),&local_28);
    pvVar1 = (void *)(local_28 + (long)buf);
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VBufUnpack)(N_Vector x, void* buf)
{
  SUNFunctionBegin(x->sunctx);
  void* loc;           /* location in input buffer */
  sunindextype offset; /* subvector buffer offset   */
  sunindextype i;

  SUNAssert(buf, SUN_ERR_ARG_CORRUPT);

  /* start at the beginning of the input buffer */
  loc = buf;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* unpack the input buffer starting at the given buffer location */
    SUNCheckCall(N_VBufUnpack(MANYVECTOR_SUBVEC(x, i), loc));

    /* get the offset from this subvector */
    SUNCheckCall(N_VBufSize(MANYVECTOR_SUBVEC(x, i), &offset));

    /* update the buffer location for the next vector */
    loc = (char*)buf + offset;
  }

  return SUN_SUCCESS;
}